

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::TPZCompElWithMem
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZInterfaceElement> *copy)

{
  *(undefined ***)&(this->super_TPZInterfaceElement).super_TPZCompEl = &PTR__TPZSavable_0175d048;
  TPZInterfaceElement::TPZInterfaceElement
            (&this->super_TPZInterfaceElement,&PTR_PTR_0175c290,mesh,
             &copy->super_TPZInterfaceElement);
  *(undefined ***)&(this->super_TPZInterfaceElement).super_TPZCompEl =
       &PTR__TPZCompElWithMem_0175c030;
  TPZStack<long,_128>::TPZStack(&this->fIntPtIndices);
  CopyIntPtIndicesFrom(this,copy);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh, const TPZCompElWithMem<TBASE> &copy) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh, copy) {
    CopyIntPtIndicesFrom(copy);
}